

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int set_file_mtime(char **argv)

{
  FILE *__stream;
  int iVar1;
  ulonglong uVar2;
  ulonglong uVar3;
  undefined8 uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  uVar3 = strtoull(argv[1],(char **)0x0,10);
  iVar1 = zip_file_set_mtime(za,uVar2,uVar3,0);
  __stream = _stderr;
  if (iVar1 < 0) {
    uVar4 = zip_strerror(za);
    fprintf(__stream,"can\'t set file mtime at index \'%lu\' to \'%lld\': %s\n",uVar2,uVar3,uVar4);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int
set_file_mtime(char *argv[]) {
    /* set file last modification time (mtime) */
    time_t mtime;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    mtime = (time_t)strtoull(argv[1], NULL, 10);
    if (zip_file_set_mtime(za, idx, mtime, 0) < 0) {
        fprintf(stderr, "can't set file mtime at index '%" PRIu64 "' to '%lld': %s\n", idx, (long long)mtime, zip_strerror(za));
        return -1;
    }
    return 0;
}